

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::WasmByteCodeWriter::AsmCall
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool success;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  AsmJsRetType retType_local;
  
  functionRegister_local._2_2_ = op;
  _returnValueRegister_local = this;
  this_local._4_4_ = retType.which_;
  bVar2 = ByteCodeWriter::DoDynamicProfileOpcode(&this->super_ByteCodeWriter,InlinePhase,false);
  if (((bVar2) && (profileId != 0xffff)) &&
     (bVar2 = OpCodeAttrAsmJs::HasProfiledOp(functionRegister_local._2_2_), bVar2)) {
    OpCodeUtilAsmJs::ConvertOpToProfiled((OpCodeAsmJs *)((long)&functionRegister_local + 2));
  }
  bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,functionRegister_local._2_2_,returnValueRegister,functionRegister,
                     givenArgCount,this_local._4_4_);
  if (((!bVar2) &&
      (bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,functionRegister_local._2_2_,returnValueRegister,functionRegister,
                          givenArgCount,this_local._4_4_), !bVar2)) &&
     (bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,functionRegister_local._2_2_,returnValueRegister,functionRegister,
                         givenArgCount,this_local._4_4_), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x25b,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttrAsmJs::IsProfiledOp(functionRegister_local._2_2_);
  if (bVar2) {
    ByteCodeWriter::Data::Encode(&(this->super_ByteCodeWriter).m_byteCodeData,&profileId,2);
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType, Js::ProfileId profileId)
    {
        if (DoDynamicProfileOpcode(InlinePhase) && profileId != Js::Constants::NoProfileId && OpCodeAttrAsmJs::HasProfiledOp(op))
        {
            OpCodeUtilAsmJs::ConvertOpToProfiled(&op);
        }
        MULTISIZE_LAYOUT_WRITE(AsmCall, op, returnValueRegister, functionRegister, givenArgCount, retType);
        if (OpCodeAttrAsmJs::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }